

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O3

imgviz * __thiscall imgviz::labelToBgr(imgviz *this,Mat *label,Mat *bgr,double alpha)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  byte bVar4;
  int i;
  long lVar5;
  uint8_t r;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  int in_R8D;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  uint8_t b;
  byte bVar13;
  undefined1 uVar14;
  uint8_t g;
  byte bVar15;
  __m128d t;
  Vec3b label_color;
  Mat bgr_;
  Vec3b bgr_color;
  undefined2 local_219;
  undefined1 local_217;
  byte abStack_216 [6];
  double local_210;
  _InputArray local_208;
  undefined8 local_1f0;
  uint local_1e8 [4];
  long local_1d8;
  long *local_1a0;
  undefined2 local_188;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined4 uStack_184;
  Mat *local_180;
  undefined8 local_178 [12];
  Mat local_118 [96];
  Mat local_b8 [144];
  
  local_210 = alpha;
  cv::Mat::clone();
  if ((*(ushort *)bgr & 0xfff) == 0) {
    local_178[0] = 0;
    local_188 = 0;
    uStack_186 = 1;
    uStack_185 = 1;
    local_208.sz.width = 0;
    local_208.sz.height = 0;
    local_208.flags = 0x2010000;
    local_208.obj = local_1e8;
    local_180 = bgr;
    cv::cvtColor((cv *)&local_188,&local_208,(_OutputArray *)0x8,0,in_R8D);
  }
  if ((*(uint *)label & 0xfff) == 4) {
    if ((local_1e8[0] & 0xfff) == 0x10) {
      local_1f0 = CONCAT44((int)**(undefined8 **)(label + 0x40),
                           (int)((ulong)**(undefined8 **)(label + 0x40) >> 0x20));
      cv::Mat::zeros(&local_188,&local_1f0,0x10);
      cv::Mat::Mat((Mat *)this);
      plVar2 = (long *)CONCAT44(uStack_184,CONCAT13(uStack_185,CONCAT12(uStack_186,local_188)));
      (**(code **)(*plVar2 + 0x18))(plVar2,&local_188,this,0xffffffff);
      cv::Mat::~Mat(local_b8);
      cv::Mat::~Mat(local_118);
      cv::Mat::~Mat((Mat *)local_178);
      iVar12 = *(int *)(label + 8);
      if (iVar12 != 0) {
        uVar10 = (ulong)*(uint *)(label + 0xc);
        uVar3 = 0;
        do {
          iVar9 = (int)uVar10;
          uVar10 = 0;
          if (iVar9 != 0) {
            lVar7 = (long)(int)uVar3;
            uVar8 = 0;
            do {
              iVar12 = local_208.flags;
              lVar5 = *local_1a0 * lVar7 + local_1d8;
              lVar1 = (long)(int)uVar8 * 3;
              local_188 = *(undefined2 *)(lVar5 + lVar1);
              uStack_186 = *(undefined1 *)(lVar5 + 2 + lVar1);
              bVar11 = *(byte *)(**(long **)(label + 0x48) * lVar7 + *(long *)(label + 0x10) +
                                (long)(int)uVar8 * 4);
              lVar5 = 8;
              bVar13 = 0;
              bVar15 = 0;
              bVar6 = 0;
              do {
                lVar5 = lVar5 + -1;
                bVar4 = (byte)lVar5;
                bVar6 = bVar6 | (byte)((bVar11 & 1) << (bVar4 & 0x1f));
                bVar15 = bVar15 | (byte)((bVar11 >> 1 & 1) << (bVar4 & 0x1f));
                bVar13 = bVar13 | (byte)((bVar11 >> 2 & 1) << (bVar4 & 0x1f));
                bVar11 = bVar11 >> 3;
              } while (lVar5 != 0);
              local_208.flags._3_1_ = SUB41(iVar12,3);
              local_208.flags._0_3_ = CONCAT12(bVar6,CONCAT11(bVar15,bVar13));
              lVar5 = 0;
              do {
                iVar12 = (int)ROUND((double)*(byte *)((long)&local_208.flags + lVar5) * local_210);
                if (iVar12 < 1) {
                  iVar12 = 0;
                }
                if (0xfe < iVar12) {
                  iVar12 = 0xff;
                }
                abStack_216[lVar5 + 3] = (byte)iVar12;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = 0;
              do {
                iVar12 = (int)ROUND((double)*(byte *)((long)&local_188 + lVar5) * (1.0 - local_210))
                ;
                if (iVar12 < 1) {
                  iVar12 = 0;
                }
                if (0xfe < iVar12) {
                  iVar12 = 0xff;
                }
                abStack_216[lVar5] = (byte)iVar12;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = 0;
              do {
                uVar14 = (undefined1)((uint)abStack_216[lVar5] + (uint)abStack_216[lVar5 + 3]);
                if (0xfe < (uint)abStack_216[lVar5] + (uint)abStack_216[lVar5 + 3]) {
                  uVar14 = 0xff;
                }
                *(undefined1 *)((long)&local_219 + lVar5) = uVar14;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = **(long **)(this + 0x48) * lVar7 + *(long *)(this + 0x10);
              *(undefined1 *)(lVar5 + 2 + lVar1) = local_217;
              *(undefined2 *)(lVar5 + lVar1) = local_219;
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)*(int *)(label + 0xc);
            } while (uVar8 < uVar10);
            iVar12 = *(int *)(label + 8);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)(long)iVar12);
      }
      cv::Mat::~Mat((Mat *)local_1e8);
      return this;
    }
    __assert_fail("bgr_.type() == CV_8UC3",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,0x101,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
  }
  __assert_fail("label.type() == CV_32SC1",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                ,0x100,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
}

Assistant:

cv::Mat labelToBgr(const cv::Mat label, const cv::Mat bgr,
                   const double alpha = 0.5) {
  cv::Mat bgr_ = bgr.clone();
  if (bgr.type() == CV_8UC1) {
    cv::cvtColor(bgr, bgr_, cv::COLOR_GRAY2BGR);
  }

  assert(label.type() == CV_32SC1);
  assert(bgr_.type() == CV_8UC3);

  cv::Mat label_bgr = cv::Mat::zeros(label.size(), CV_8UC3);

  for (size_t j = 0; j < label.rows; j++) {
    for (size_t i = 0; i < label.cols; i++) {
      cv::Vec3b bgr_color = bgr_.at<cv::Vec3b>(j, i);
      cv::Vec3b label_color = getLabelColor(label.at<int32_t>(j, i) % 256);
      label_bgr.at<cv::Vec3b>(j, i) =
          alpha * label_color + (1 - alpha) * bgr_color;
    }
  }
  return label_bgr;
}